

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void __thiscall
duckdb::CreateSortKeyHelpers::DecodeSortKey
          (CreateSortKeyHelpers *this,string_t sort_key,DataChunk *result,idx_t result_idx,
          vector<duckdb::OrderModifiers,_true> *modifiers)

{
  OrderModifiers modifiers_00;
  reference result_00;
  const_reference pvVar1;
  vector<duckdb::Vector,_true> *this_00;
  size_type __n;
  DecodeSortKeyData decode_data;
  DecodeSortKeyVectorData vector_data;
  DecodeSortKeyData local_80;
  DecodeSortKeyVectorData local_68;
  undefined8 local_40;
  const_data_ptr_t local_38;
  
  this_00 = sort_key.value._8_8_;
  local_38 = sort_key.value._0_8_;
  local_80.size = (ulong)this & 0xffffffff;
  local_80.data = local_38;
  if (local_80.size < 0xd) {
    local_80.data = (const_data_ptr_t)((long)&local_40 + 4);
  }
  local_80.position = 0;
  if ((this_00->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_00->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    local_40 = this;
    do {
      result_00 = vector<duckdb::Vector,_true>::operator[](this_00,__n);
      pvVar1 = vector<duckdb::OrderModifiers,_true>::operator[]
                         ((vector<duckdb::OrderModifiers,_true> *)result_idx,__n);
      modifiers_00.order_type = pvVar1->order_type;
      modifiers_00.null_type = pvVar1->null_type;
      DecodeSortKeyVectorData::DecodeSortKeyVectorData(&local_68,&result_00->type,modifiers_00);
      DecodeSortKeyRecursive(&local_80,&local_68,result_00,(idx_t)result);
      ::std::
      vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>::
      ~vector(&local_68.child_data.
               super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
             );
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this_00->
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void CreateSortKeyHelpers::DecodeSortKey(string_t sort_key, DataChunk &result, idx_t result_idx,
                                         const vector<OrderModifiers> &modifiers) {
	DecodeSortKeyData decode_data(sort_key);
	D_ASSERT(modifiers.size() == result.ColumnCount());
	for (idx_t c = 0; c < result.ColumnCount(); c++) {
		auto &vec = result.data[c];
		DecodeSortKeyVectorData vector_data(vec.GetType(), modifiers[c]);
		DecodeSortKeyRecursive(decode_data, vector_data, vec, result_idx);
	}
}